

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O0

int cmcmd::ExecuteLinkScript
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *args)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  size_type sVar4;
  const_reference pvVar5;
  long lVar6;
  cmsysProcess *cp_00;
  ostream *poVar7;
  char *pcVar8;
  bool local_2e1;
  char *pcStack_2a8;
  int value;
  char *cmd [2];
  int local_28c;
  undefined1 local_288 [4];
  int result;
  string command;
  long local_260;
  ifstream fin;
  cmsysProcess *cp;
  string local_40;
  byte local_19;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_18;
  bool verbose;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_19 = 0;
  pvStack_18 = args;
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (3 < sVar4) {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](pvStack_18,3);
    lVar6 = std::__cxx11::string::find((char *)pvVar5,0x873847);
    if (lVar6 == 0) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](pvStack_18,3);
      std::__cxx11::string::substr((ulong)&local_40,(ulong)pvVar5);
      bVar1 = cmSystemTools::IsOff(&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        local_19 = 1;
      }
    }
  }
  cp_00 = cmsysProcess_New();
  if (cp_00 == (cmsysProcess *)0x0) {
    poVar7 = std::operator<<((ostream *)&std::cerr,
                             "Error allocating process instance in link script.");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    args_local._4_4_ = 1;
  }
  else {
    cmsysProcess_SetPipeShared(cp_00,2,1);
    cmsysProcess_SetPipeShared(cp_00,3,1);
    cmsysProcess_SetOption(cp_00,3,1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](pvStack_18,2);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream(&local_260,pcVar8,_S_in);
    bVar2 = std::ios::operator!((ios *)((long)&local_260 + *(long *)(local_260 + -0x18)));
    if ((bVar2 & 1) == 0) {
      std::__cxx11::string::string((string *)local_288);
      local_28c = 0;
      while( true ) {
        local_2e1 = false;
        if (local_28c == 0) {
          local_2e1 = cmsys::SystemTools::GetLineFromStream
                                ((istream *)&local_260,(string *)local_288,(bool *)0x0,-1);
        }
        if (local_2e1 == false) break;
        lVar6 = std::__cxx11::string::find_first_not_of(local_288,0x8738a0);
        if (lVar6 != -1) {
          pcStack_2a8 = (char *)std::__cxx11::string::c_str();
          cmd[0] = (char *)0x0;
          cmsysProcess_SetCommand(cp_00,&stack0xfffffffffffffd58);
          if ((local_19 & 1) != 0) {
            poVar7 = std::operator<<((ostream *)&std::cout,(string *)local_288);
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          }
          cmsysProcess_Execute(cp_00);
          cmsysProcess_WaitForExit(cp_00,(double *)0x0);
          iVar3 = cmsysProcess_GetState(cp_00);
          if (iVar3 == 1) {
            poVar7 = std::operator<<((ostream *)&std::cerr,"Error running link command: ");
            pcVar8 = cmsysProcess_GetErrorString(cp_00);
            poVar7 = std::operator<<(poVar7,pcVar8);
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            local_28c = 2;
          }
          else if (iVar3 == 2) {
            poVar7 = std::operator<<((ostream *)&std::cerr,"Error running link command: ");
            pcVar8 = cmsysProcess_GetExceptionString(cp_00);
            poVar7 = std::operator<<(poVar7,pcVar8);
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            local_28c = 1;
          }
          else if ((iVar3 == 4) && (iVar3 = cmsysProcess_GetExitValue(cp_00), iVar3 != 0)) {
            local_28c = iVar3;
          }
        }
      }
      cmsysProcess_Delete(cp_00);
      args_local._4_4_ = local_28c;
      command.field_2._12_4_ = 1;
      std::__cxx11::string::~string((string *)local_288);
    }
    else {
      poVar7 = std::operator<<((ostream *)&std::cerr,"Error opening link script \"");
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](pvStack_18,2);
      poVar7 = std::operator<<(poVar7,(string *)pvVar5);
      poVar7 = std::operator<<(poVar7,"\"");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      args_local._4_4_ = 1;
      command.field_2._12_4_ = 1;
    }
    std::ifstream::~ifstream(&local_260);
  }
  return args_local._4_4_;
}

Assistant:

int cmcmd::ExecuteLinkScript(std::vector<std::string> const& args)
{
  // The arguments are
  //   args[0] == <cmake-executable>
  //   args[1] == cmake_link_script
  //   args[2] == <link-script-name>
  //   args[3] == --verbose=?
  bool verbose = false;
  if (args.size() >= 4) {
    if (args[3].find("--verbose=") == 0) {
      if (!cmSystemTools::IsOff(args[3].substr(10))) {
        verbose = true;
      }
    }
  }

  // Allocate a process instance.
  cmsysProcess* cp = cmsysProcess_New();
  if (!cp) {
    std::cerr << "Error allocating process instance in link script."
              << std::endl;
    return 1;
  }

  // Children should share stdout and stderr with this process.
  cmsysProcess_SetPipeShared(cp, cmsysProcess_Pipe_STDOUT, 1);
  cmsysProcess_SetPipeShared(cp, cmsysProcess_Pipe_STDERR, 1);

  // Run the command lines verbatim.
  cmsysProcess_SetOption(cp, cmsysProcess_Option_Verbatim, 1);

  // Read command lines from the script.
  cmsys::ifstream fin(args[2].c_str());
  if (!fin) {
    std::cerr << "Error opening link script \"" << args[2] << "\""
              << std::endl;
    return 1;
  }

  // Run one command at a time.
  std::string command;
  int result = 0;
  while (result == 0 && cmSystemTools::GetLineFromStream(fin, command)) {
    // Skip empty command lines.
    if (command.find_first_not_of(" \t") == std::string::npos) {
      continue;
    }

    // Setup this command line.
    const char* cmd[2] = { command.c_str(), nullptr };
    cmsysProcess_SetCommand(cp, cmd);

    // Report the command if verbose output is enabled.
    if (verbose) {
      std::cout << command << std::endl;
    }

    // Run the command and wait for it to exit.
    cmsysProcess_Execute(cp);
    cmsysProcess_WaitForExit(cp, nullptr);

    // Report failure if any.
    switch (cmsysProcess_GetState(cp)) {
      case cmsysProcess_State_Exited: {
        int value = cmsysProcess_GetExitValue(cp);
        if (value != 0) {
          result = value;
        }
      } break;
      case cmsysProcess_State_Exception:
        std::cerr << "Error running link command: "
                  << cmsysProcess_GetExceptionString(cp) << std::endl;
        result = 1;
        break;
      case cmsysProcess_State_Error:
        std::cerr << "Error running link command: "
                  << cmsysProcess_GetErrorString(cp) << std::endl;
        result = 2;
        break;
      default:
        break;
    }
  }

  // Free the process instance.
  cmsysProcess_Delete(cp);

  // Return the final resulting return value.
  return result;
}